

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O3

void __thiscall
boost::scoped_ptr<boost::io::ios_base_all_saver>::reset
          (scoped_ptr<boost::io::ios_base_all_saver> *this,ios_base_all_saver *p)

{
  scoped_ptr<boost::io::ios_base_all_saver> local_8;
  
  if (p == (ios_base_all_saver *)0x0) {
    local_8 = (scoped_ptr<boost::io::ios_base_all_saver>)this->px;
  }
  else {
    local_8 = (scoped_ptr<boost::io::ios_base_all_saver>)this->px;
    if (local_8.px == p) {
      __assert_fail("p == 0 || p != px",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/scoped_ptr.hpp"
                    ,0x5d,
                    "void boost::scoped_ptr<boost::io::ios_base_all_saver>::reset(T *) [T = boost::io::ios_base_all_saver]"
                   );
    }
  }
  this->px = p;
  ~scoped_ptr(&local_8);
  return;
}

Assistant:

void reset(T * p = 0) BOOST_SP_NOEXCEPT_WITH_ASSERT
    {
        BOOST_ASSERT( p == 0 || p != px ); // catch self-reset errors
        this_type(p).swap(*this);
    }